

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O3

void __thiscall
chrono::collision::cbtCapsuleBoxCollisionAlgorithm::processCollision
          (cbtCapsuleBoxCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0,
          cbtCollisionObjectWrapper *body1,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  float fVar1;
  cbtScalar cVar2;
  int iVar3;
  cbtTransform *pcVar4;
  cbtTransform *pcVar5;
  cbtCollisionShape *pcVar6;
  cbtCollisionShape *pcVar7;
  cbtPersistentManifold *this_00;
  cbtCollisionObject *pcVar8;
  cbtCollisionObject *pcVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  pointer pfVar14;
  cbtVector3 cVar15;
  cbtVector3 cVar16;
  bool bVar17;
  cbtCollisionObjectWrapper *pcVar18;
  cbtCollisionObject *pcVar19;
  long lVar20;
  pointer pfVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  ulong uVar29;
  undefined8 uVar32;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  initializer_list<float> __l;
  vector<float,_std::allocator<float>_> t_points;
  cbtScalar tMax;
  cbtScalar tMin;
  cbtVector3 a;
  cbtVector3 c1;
  cbtVector3 c2;
  cbtVector3 hdims;
  float local_134;
  vector<float,_std::allocator<float>_> local_130;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  float local_104;
  cbtScalar local_100;
  cbtScalar local_fc;
  cbtVector3 local_f8;
  undefined1 local_e8 [16];
  cbtManifoldResult *local_d8;
  float local_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  cbtVector3 local_b8;
  cbtVector3 local_a8;
  ulong local_98;
  undefined8 uStack_90;
  cbtCapsuleBoxCollisionAlgorithm *local_80;
  cbtVector3 local_78;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  cbtVector3 local_40;
  
  local_f8.m_floats._8_8_ = local_f8.m_floats._0_8_;
  if (this->m_manifoldPtr != (cbtPersistentManifold *)0x0) {
    bVar17 = this->m_isSwapped;
    resultOut->m_manifoldPtr = this->m_manifoldPtr;
    pcVar18 = body1;
    if (bVar17 != false) {
      pcVar18 = body0;
      body0 = body1;
    }
    pcVar4 = body0->m_worldTransform;
    pcVar5 = pcVar18->m_worldTransform;
    pcVar6 = pcVar18->m_shape;
    pcVar7 = body0->m_shape;
    fVar28 = (pcVar4->m_basis).m_el[1].m_floats[1];
    fVar1 = (pcVar5->m_basis).m_el[1].m_floats[2];
    uVar32 = *(undefined8 *)(pcVar5->m_basis).m_el[1].m_floats;
    cVar2 = (pcVar4->m_basis).m_el[0].m_floats[1];
    auVar26._4_4_ = cVar2;
    auVar26._0_4_ = cVar2;
    auVar26._8_4_ = cVar2;
    auVar26._12_4_ = cVar2;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = *(ulong *)(pcVar5->m_basis).m_el[0].m_floats;
    cVar2 = (pcVar4->m_basis).m_el[2].m_floats[1];
    auVar36._4_4_ = cVar2;
    auVar36._0_4_ = cVar2;
    auVar36._8_4_ = cVar2;
    auVar36._12_4_ = cVar2;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = *(ulong *)(pcVar5->m_basis).m_el[2].m_floats;
    fVar10 = (pcVar4->m_origin).m_floats[1] - (pcVar5->m_origin).m_floats[1];
    fVar11 = (pcVar4->m_origin).m_floats[0] - (pcVar5->m_origin).m_floats[0];
    fVar12 = (pcVar4->m_origin).m_floats[2] - (pcVar5->m_origin).m_floats[2];
    fVar40 = (float)uVar32;
    auVar25._0_4_ = fVar40 * fVar28;
    fVar38 = (float)((ulong)uVar32 >> 0x20);
    auVar25._4_4_ = fVar38 * fVar28;
    auVar25._8_4_ = fVar28 * 0.0;
    auVar25._12_4_ = fVar28 * 0.0;
    auVar24 = ZEXT416((uint)(pcVar5->m_basis).m_el[0].m_floats[2]);
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar1)),auVar24,auVar26);
    auVar22 = vfmadd231ps_fma(auVar25,auVar41,auVar26);
    auVar23._0_4_ = fVar40 * fVar10;
    auVar23._4_4_ = fVar38 * fVar10;
    auVar23._8_4_ = fVar10 * 0.0;
    auVar23._12_4_ = fVar10 * 0.0;
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar1)),auVar24,ZEXT416((uint)fVar11));
    auVar26 = ZEXT416((uint)(pcVar5->m_basis).m_el[2].m_floats[2]);
    auVar25 = vfmadd231ss_fma(auVar13,auVar26,auVar36);
    auVar13 = vfmadd231ps_fma(auVar22,auVar42,auVar36);
    auVar39._4_4_ = fVar11;
    auVar39._0_4_ = fVar11;
    auVar39._8_4_ = fVar11;
    auVar39._12_4_ = fVar11;
    auVar22 = vfmadd213ps_fma(auVar39,auVar41,auVar23);
    auVar27._4_4_ = fVar12;
    auVar27._0_4_ = fVar12;
    auVar27._8_4_ = fVar12;
    auVar27._12_4_ = fVar12;
    auVar24 = vfmadd231ss_fma(auVar24,auVar26,ZEXT416((uint)fVar12));
    local_b8.m_floats = (cbtScalar  [4])vinsertps_avx(auVar13,auVar25,0x28);
    _local_68 = vfmadd213ps_fma(auVar27,auVar42,auVar22);
    local_104 = auVar24._0_4_;
    _fStack_110 = 0;
    local_118 = (undefined1  [8])*(ulong *)&pcVar6[1].field_0xc;
    uVar29 = *(ulong *)((long)&pcVar6[1].m_userPointer + 4);
    uVar32 = 0;
    local_e8._8_8_ = 0;
    local_e8._0_8_ = uVar29;
    local_d8 = resultOut;
    local_80 = this;
    (*pcVar6->_vptr_cbtCollisionShape[0xc])(pcVar6);
    local_c8 = (float)uVar29;
    fStack_c4 = (float)(uVar29 >> 0x20);
    fStack_c0 = (float)uVar32;
    fStack_bc = (float)((ulong)uVar32 >> 0x20);
    (*pcVar6->_vptr_cbtCollisionShape[0xc])(pcVar6);
    local_98 = uVar29;
    uStack_90 = uVar32;
    (*pcVar6->_vptr_cbtCollisionShape[0xc])(pcVar6);
    auVar13._4_4_ = fStack_c4;
    auVar13._0_4_ = local_c8;
    auVar13._8_4_ = fStack_c0;
    auVar13._12_4_ = fStack_bc;
    auVar22 = vinsertps_avx(auVar13,ZEXT416((uint)(float)local_98),0x10);
    auVar24._0_4_ = auVar22._0_4_ + (float)local_118._0_4_;
    auVar24._4_4_ = auVar22._4_4_ + (float)local_118._4_4_;
    auVar24._8_4_ = auVar22._8_4_ + fStack_110;
    auVar24._12_4_ = auVar22._12_4_ + fStack_10c;
    auVar22 = vinsertps_avx(ZEXT416((uint)(local_e8._0_4_ + (float)uVar29)),local_e8,0x5c);
    local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar24,auVar22);
    iVar3 = *(int *)((long)&pcVar7[2]._vptr_cbtCollisionShape + 4);
    local_f8.m_floats[1] = *(cbtScalar *)(&pcVar7[1].field_0xc + (long)iVar3 * 4);
    _local_118 = ZEXT416((uint)local_f8.m_floats[1]);
    local_c8 = *(float *)(&pcVar7[1].field_0xc + (long)((iVar3 + 2) % 3) * 4);
    local_98 = CONCAT44(local_98._4_4_,(local_f8.m_floats[1] + local_f8.m_floats[1]) * 0.0001);
    auVar22._8_4_ = 0x80000000;
    auVar22._0_8_ = 0x8000000080000000;
    auVar22._12_4_ = 0x80000000;
    local_e8 = vxorps_avx512vl(_local_118,auVar22);
    local_f8.m_floats[0] = local_e8._0_4_;
    __l._M_len = 2;
    __l._M_array = local_f8.m_floats;
    fStack_c4 = local_c8;
    fStack_c0 = local_c8;
    fStack_bc = local_c8;
    std::vector<float,_std::allocator<float>_>::vector(&local_130,__l,(allocator_type *)&local_a8);
    lVar20 = 0;
    do {
      cVar16.m_floats = local_b8.m_floats;
      local_f8.m_floats = (cbtScalar  [4])ZEXT816(0);
      local_f8.m_floats[lVar20] = 1.0;
      cVar15.m_floats = local_f8.m_floats;
      auVar43._8_4_ = 0x7fffffff;
      auVar43._0_8_ = 0x7fffffff7fffffff;
      auVar43._12_4_ = 0x7fffffff;
      auVar22 = vandps_avx512vl(ZEXT416((uint)(local_b8.m_floats[lVar20] + -1.0)),auVar43);
      if (1e-05 <= auVar22._0_4_) {
        auVar33._8_8_ = 0;
        auVar33._0_4_ = local_b8.m_floats[0];
        auVar33._4_4_ = local_b8.m_floats[1];
        auVar35._8_8_ = 0;
        auVar35._0_4_ = local_f8.m_floats[0];
        auVar35._4_4_ = local_f8.m_floats[1];
        local_f8.m_floats[2] = cVar15.m_floats[2];
        auVar22 = vinsertps_avx(ZEXT416((uint)local_b8.m_floats[2]),auVar33,0x1c);
        auVar13 = vinsertps_avx(ZEXT416((uint)local_f8.m_floats[2]),auVar35,0x1c);
        auVar37._0_4_ = auVar22._0_4_ * cVar15.m_floats[0];
        auVar37._4_4_ = auVar22._4_4_ * cVar15.m_floats[1];
        auVar37._8_4_ = auVar22._8_4_ * 0.0;
        auVar37._12_4_ = auVar22._12_4_ * 0.0;
        auVar24 = vmovshdup_avx(auVar35);
        auVar26 = vfmsub213ps_fma(auVar13,auVar33,auVar37);
        auVar25 = vmovshdup_avx(auVar33);
        auVar24 = vfmsub213ss_fma(auVar24,ZEXT416((uint)local_b8.m_floats[2]),
                                  ZEXT416((uint)(auVar25._0_4_ * local_f8.m_floats[2])));
        auVar13 = vinsertps_avx(auVar25,ZEXT416((uint)local_b8.m_floats[2]),0x10);
        auVar23 = vpermt2ps_avx512vl(auVar26,_DAT_009d86b0,auVar24);
        auVar30._0_4_ = auVar13._0_4_ * auVar23._0_4_;
        auVar30._4_4_ = auVar13._4_4_ * auVar23._4_4_;
        auVar30._8_4_ = auVar13._8_4_ * auVar23._8_4_;
        auVar30._12_4_ = auVar13._12_4_ * auVar23._12_4_;
        auVar22 = vfmsub231ps_fma(auVar30,auVar26,auVar22);
        auVar13 = vfmsub231ss_fma(ZEXT416((uint)(cVar16.m_floats[0] * auVar26._0_4_)),auVar25,
                                  auVar24);
        fVar28 = local_c8 * auVar13._0_4_;
        auVar31._0_4_ = local_c8 * auVar22._0_4_;
        auVar31._4_4_ = fStack_c4 * auVar22._4_4_;
        auVar31._8_4_ = fStack_c0 * auVar22._8_4_;
        auVar31._12_4_ = fStack_bc * auVar22._12_4_;
        auVar34._0_4_ = local_68._0_4_ + auVar31._0_4_;
        auVar34._4_4_ = local_68._4_4_ + auVar31._4_4_;
        auVar34._8_4_ = local_68._8_4_ + auVar31._8_4_;
        auVar34._12_4_ = local_68._12_4_ + auVar31._12_4_;
        auVar22 = vsubps_avx(_local_68,auVar31);
        local_a8.m_floats =
             (cbtScalar  [4])vinsertps_avx(auVar34,ZEXT416((uint)(local_104 + fVar28)),0x28);
        local_78.m_floats =
             (cbtScalar  [4])vinsertps_avx(auVar22,ZEXT416((uint)(local_104 - fVar28)),0x28);
        local_f8.m_floats = cVar15.m_floats;
        local_b8.m_floats = cVar16.m_floats;
        bVar17 = bt_utils::IntersectSegmentBox
                           (&local_40,&local_a8,&local_b8,(cbtScalar)local_118._0_4_,1e-05,&local_fc
                            ,&local_100);
        if (bVar17) {
          auVar22 = vminss_avx(_local_118,ZEXT416((uint)local_fc));
          uVar32 = vcmpss_avx512f(ZEXT416((uint)local_fc),local_e8,1);
          bVar17 = (bool)((byte)uVar32 & 1);
          local_134 = (float)((uint)bVar17 * local_e8._0_4_ + (uint)!bVar17 * auVar22._0_4_);
          if (local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_130,
                       (iterator)
                       local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_134);
          }
          else {
            *local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = local_134;
            local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          auVar22 = vminss_avx(_local_118,ZEXT416((uint)local_100));
          uVar32 = vcmpss_avx512f(ZEXT416((uint)local_100),local_e8,1);
          bVar17 = (bool)((byte)uVar32 & 1);
          local_134 = (float)((uint)bVar17 * local_e8._0_4_ + (uint)!bVar17 * auVar22._0_4_);
          if (local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_130,
                       (iterator)
                       local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_134);
          }
          else {
            *local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = local_134;
            local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        bVar17 = bt_utils::IntersectSegmentBox
                           (&local_40,&local_78,&local_b8,(cbtScalar)local_118._0_4_,1e-05,&local_fc
                            ,&local_100);
        if (bVar17) {
          auVar22 = vminss_avx(_local_118,ZEXT416((uint)local_fc));
          uVar32 = vcmpss_avx512f(ZEXT416((uint)local_fc),local_e8,1);
          bVar17 = (bool)((byte)uVar32 & 1);
          local_134 = (float)((uint)bVar17 * local_e8._0_4_ + (uint)!bVar17 * auVar22._0_4_);
          if (local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_130,
                       (iterator)
                       local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_134);
          }
          else {
            *local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = local_134;
            local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          auVar22 = vminss_avx(_local_118,ZEXT416((uint)local_100));
          uVar32 = vcmpss_avx512f(ZEXT416((uint)local_100),local_e8,1);
          bVar17 = (bool)((byte)uVar32 & 1);
          local_134 = (float)((uint)bVar17 * local_e8._0_4_ + (uint)!bVar17 * auVar22._0_4_);
          if (local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_130,
                       (iterator)
                       local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_134);
          }
          else {
            *local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = local_134;
            local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      pfVar21 = local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pfVar14 = local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    if (local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (int)LZCOUNT((long)local_130.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_130.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pfVar14,pfVar21);
      pfVar14 = local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        fVar28 = (float)local_118._0_4_ * -2.0;
        local_cc = local_c8 * local_c8;
        pfVar21 = local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          fVar1 = *pfVar21;
          if ((float)local_98 <= fVar1 - fVar28) {
            local_58 = ZEXT416((uint)fVar1);
            local_e8._0_4_ = fVar1 * local_b8.m_floats[0] + (float)local_68._0_4_;
            local_e8._4_4_ = fVar1 * local_b8.m_floats[1] + (float)local_68._4_4_;
            local_e8._8_4_ = fVar1 * 0.0 + fStack_60;
            local_e8._12_4_ = fVar1 * 0.0 + fStack_5c;
            _local_118 = ZEXT416((uint)(fVar1 * local_b8.m_floats[2] + local_104));
            local_f8.m_floats = (cbtScalar  [4])vinsertps_avx(local_e8,_local_118,0x28);
            bt_utils::SnapPointToBox(&local_40,&local_f8);
            fVar1 = local_e8._0_4_ - local_f8.m_floats[0];
            auVar22 = vmovshdup_avx(local_e8);
            fVar28 = auVar22._0_4_ - local_f8.m_floats[1];
            fVar10 = (float)local_118._0_4_ - local_f8.m_floats[2];
            auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28)),ZEXT416((uint)fVar1),
                                      ZEXT416((uint)fVar1));
            auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)fVar10),ZEXT416((uint)fVar10));
            if ((auVar22._0_4_ < local_cc) && (1e-12 < auVar22._0_4_)) {
              auVar13 = vsqrtss_avx(auVar22,auVar22);
              fVar11 = (pcVar5->m_basis).m_el[1].m_floats[1];
              fVar12 = (pcVar5->m_basis).m_el[2].m_floats[1];
              fVar38 = 1.0 / auVar13._0_4_;
              fVar40 = (pcVar5->m_basis).m_el[0].m_floats[1];
              fVar28 = fVar28 * fVar38;
              fVar1 = fVar1 * fVar38;
              fVar10 = fVar10 * fVar38;
              auVar26 = ZEXT416((uint)(pcVar5->m_basis).m_el[0].m_floats[0]);
              auVar24 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar40 * fVar28)),auVar26,
                                            ZEXT416((uint)fVar1));
              auVar41 = ZEXT416((uint)(pcVar5->m_basis).m_el[1].m_floats[0]);
              auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar28)),auVar41,
                                        ZEXT416((uint)fVar1));
              auVar30 = ZEXT416((uint)(pcVar5->m_basis).m_el[2].m_floats[0]);
              auVar25 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar12 * fVar28)),auVar30,
                                            ZEXT416((uint)fVar1));
              auVar27 = ZEXT416((uint)local_f8.m_floats[0]);
              auVar26 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar40 * local_f8.m_floats[1])),auVar27,
                                            auVar26);
              auVar39 = ZEXT416((uint)(pcVar5->m_basis).m_el[0].m_floats[2]);
              auVar24 = vfmadd231ss_fma(auVar24,auVar39,ZEXT416((uint)fVar10));
              auVar42 = ZEXT416((uint)(pcVar5->m_basis).m_el[1].m_floats[2]);
              auVar22 = vfmadd231ss_fma(auVar22,auVar42,ZEXT416((uint)fVar10));
              auVar43 = ZEXT416((uint)(pcVar5->m_basis).m_el[2].m_floats[2]);
              auVar23 = vfmadd231ss_avx512f(auVar25,auVar43,ZEXT416((uint)fVar10));
              auVar36 = ZEXT416((uint)local_f8.m_floats[2]);
              auVar25 = vfmadd231ss_fma(auVar26,auVar36,auVar39);
              auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * local_f8.m_floats[1])),auVar27,
                                        auVar41);
              auVar27 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar12 * local_f8.m_floats[1])),auVar27,
                                            auVar30);
              auVar22 = vinsertps_avx(auVar24,auVar22,0x10);
              local_a8.m_floats = (cbtScalar  [4])vinsertps_avx(auVar22,auVar23,0x28);
              auVar24 = vfmadd231ss_avx512f(auVar27,auVar36,auVar43);
              auVar22 = vfmadd231ss_fma(auVar26,auVar36,auVar42);
              auVar22 = vinsertps_avx(ZEXT416((uint)(auVar25._0_4_ + (pcVar5->m_origin).m_floats[0])
                                             ),ZEXT416((uint)(auVar22._0_4_ +
                                                             (pcVar5->m_origin).m_floats[1])),0x10);
              local_78.m_floats =
                   (cbtScalar  [4])
                   vinsertps_avx(auVar22,ZEXT416((uint)(auVar24._0_4_ +
                                                       (pcVar5->m_origin).m_floats[2])),0x28);
              (*(local_d8->super_Result)._vptr_Result[4])
                        ((ulong)(uint)(auVar13._0_4_ - local_c8),local_d8,&local_a8,&local_78);
            }
            fVar28 = (float)local_58._0_4_;
          }
          pfVar21 = pfVar21 + 1;
        } while (pfVar21 != pfVar14);
      }
    }
    if (((local_80->m_ownManifold != false) && (local_80->m_manifoldPtr->m_cachedPoints != 0)) &&
       (this_00 = local_d8->m_manifoldPtr, this_00->m_cachedPoints != 0)) {
      pcVar8 = local_d8->m_body0Wrap->m_collisionObject;
      pcVar9 = local_d8->m_body1Wrap->m_collisionObject;
      pcVar19 = pcVar9;
      if (this_00->m_body0 == pcVar8) {
        pcVar19 = pcVar8;
        pcVar8 = pcVar9;
      }
      cbtPersistentManifold::refreshContactPoints
                (this_00,&pcVar19->m_worldTransform,&pcVar8->m_worldTransform);
    }
    if (local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (float *)0x0) {
      operator_delete(local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void cbtCapsuleBoxCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0,
                                                       const cbtCollisionObjectWrapper* body1,
                                                       const cbtDispatcherInfo& dispatchInfo,
                                                       cbtManifoldResult* resultOut) {
    (void)dispatchInfo;
    (void)resultOut;
    if (!m_manifoldPtr)
        return;

    const cbtCollisionObjectWrapper* capObjWrap = m_isSwapped ? body1 : body0;
    const cbtCollisionObjectWrapper* boxObjWrap = m_isSwapped ? body0 : body1;

    resultOut->setPersistentManifold(m_manifoldPtr);

    const cbtCapsuleShape* cap = (cbtCapsuleShape*)capObjWrap->getCollisionShape();
    const cbtBoxShape* box = (cbtBoxShape*)boxObjWrap->getCollisionShape();

    // Express capsule in the box frame
    const cbtTransform& abs_X_cap = capObjWrap->getWorldTransform();
    const cbtTransform& abs_X_box = boxObjWrap->getWorldTransform();
    cbtTransform box_X_cap = abs_X_box.inverseTimes(abs_X_cap);

    cbtVector3 a = box_X_cap.getBasis().getColumn(1);  // capsule axis (expressed in box frame)
    cbtVector3 c = box_X_cap.getOrigin();              // capsule center (expressed in box frame)

    // Box dimensions
    cbtVector3 hdims = box->getHalfExtentsWithMargin();

    // Cylinder dimensions
    cbtScalar radius = cap->getRadius();    // capsule radius
    cbtScalar hlen = cap->getHalfHeight();  // capsule half-length

    // Loop over each direction of the box frame (i.e., each of the 3 face normals).
    // In each case, consider two segments on the cylindrical surface that are on a plane defined by the axis and the
    // face normal. (Note that, in principle, we could only consider the segment "closest" to the box, but that is not
    // trivial to define in all configurations). Such segments are parameterized by t in [-H,H].
    //
    // Consider (at most) 4 candidate points on each segment: the 2 ends of the segment and the intersections of the
    // segment with the box (if such an intersection exists).
    //
    // For a capsule, projects these points back onto the capsule axis and check intersection between spheres centered
    // at the points on the axis and the box.  In this case, the projection is done orthogonal to the capsule axis.

    const cbtScalar parallel_tol = cbtScalar(1e-5);           // tolearance for parallelism tests
    const cbtScalar near_tol = cbtScalar(1e-4) * (2 * hlen);  // tolerance for line parameters of near duplicate points

    std::vector<cbtScalar> t_points = {-hlen, +hlen};  // initialize list of candidates with segment ends

    for (int i = 0; i < 3; i++) {
        // "positive" face normal
        cbtVector3 n(0, 0, 0);
        n[i] = 1;

        // If the axis is parallel to the face normal, no additional candidate point.
        cbtVector3 v = n.cross(a);
        if (std::abs(a[i] - 1) < parallel_tol)
            continue;

        // Direction perpendicular to axis
        cbtVector3 r = v.cross(a);

        // Construct center points of the two segments on cylindrical surface
        cbtVector3 c1 = c + radius * r;
        cbtVector3 c2 = c - radius * r;

        // Check if either segment intersects box.
        // If it does, append line parameters for intersection points (clamped to segment limits).
        cbtScalar tMin;
        cbtScalar tMax;
        if (bt_utils::IntersectSegmentBox(hdims, c1, a, hlen, parallel_tol, tMin, tMax)) {
            t_points.push_back(ChClamp(tMin, -hlen, +hlen));
            t_points.push_back(ChClamp(tMax, -hlen, +hlen));
        }
        if (bt_utils::IntersectSegmentBox(hdims, c2, a, hlen, parallel_tol, tMin, tMax)) {
            t_points.push_back(ChClamp(tMin, -hlen, +hlen));
            t_points.push_back(ChClamp(tMax, -hlen, +hlen));
        }
    }

    // Contact distance
    cbtScalar contactDist = radius;
    ////cbtScalar contactDist = radius + m_manifoldPtr->getContactBreakingThreshold();

    // Loop over all candidate points (points on the capsule axis) and perform a sphere-box collision test.
    // In order to eliminate near duplicate points, use a sorted list and keep track of last processed point.
    std::sort(t_points.begin(), t_points.end());
    cbtScalar t_last = -2 * hlen;
    int n_contacts = 0;
    for (auto t : t_points) {
        if (t - t_last < near_tol)
            continue;

        // Update last processed point
        t_last = t;

        // Calculate sphere center (point on axis, expressed in box frame) and snap it to the surface of the box
        cbtVector3 sphPos = c + a * t;
        cbtVector3 boxPos = sphPos;
        bt_utils::SnapPointToBox(hdims, boxPos);

        // If the distance from the sphere center to the closest point is larger than the radius plus the separation
        // value, then there is no contact. Also, ignore contact if the sphere center (almost) coincides with the
        // closest point, in which case we couldn't decide on the proper contact direction.
        cbtVector3 delta = sphPos - boxPos;
        cbtScalar dist2 = delta.length2();
        if (dist2 >= contactDist * contactDist || dist2 <= 1e-12)
            continue;

        // Generate contact information (transform to absolute frame)
        cbtScalar dist = cbtSqrt(dist2);
        cbtScalar penetration = dist - radius;
        cbtVector3 normal = abs_X_box.getBasis() * (delta / dist);
        cbtVector3 point = abs_X_box(boxPos);

        // A new contact point must specify:
        //   normal, pointing from B towards A
        //   point, located on surface of B
        //   distance, negative for penetration
        resultOut->addContactPoint(normal, point, penetration);
        n_contacts++;
    }

    if (m_ownManifold && m_manifoldPtr->getNumContacts()) {
        resultOut->refreshContactPoints();
    }
}